

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O0

pam_t * pam_copy(pam_t *pam)

{
  pam_t *ppVar1;
  uint8_t *puVar2;
  pam_t *copy;
  pam_t *pam_local;
  
  ppVar1 = (pam_t *)calloc(1,0x20);
  ppVar1->width = pam->width;
  ppVar1->height = pam->height;
  ppVar1->depth = pam->depth;
  ppVar1->maxval = pam->maxval;
  ppVar1->type = pam->type;
  ppVar1->datalen = pam->datalen;
  puVar2 = (uint8_t *)malloc((long)pam->datalen);
  ppVar1->data = puVar2;
  memcpy(ppVar1->data,pam->data,(long)pam->datalen);
  return ppVar1;
}

Assistant:

pam_t *pam_copy(pam_t *pam)
{
    pam_t *copy = calloc(1, sizeof(pam_t));
    copy->width = pam->width;
    copy->height = pam->height;
    copy->depth = pam->depth;
    copy->maxval = pam->maxval;
    copy->type = pam->type;

    copy->datalen = pam->datalen;
    copy->data = malloc(pam->datalen);
    memcpy(copy->data, pam->data, pam->datalen);

    return copy;
}